

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

void __thiscall calculator::error::error(error *this,string *expr,string *message)

{
  pointer pcVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__error_001866d8;
  (this->expr_)._M_dataplus._M_p = (pointer)&(this->expr_).field_2;
  pcVar1 = (expr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->expr_,pcVar1,pcVar1 + expr->_M_string_length);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }